

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void out_token(c2m_ctx_t c2m_ctx,token_t t)

{
  short sVar1;
  ushort uVar2;
  pre_ctx *ppVar3;
  VARR_macro_call_t *pVVar4;
  MIR_context_t pMVar5;
  MIR_error_func_t p_Var6;
  uint *puVar7;
  ushort *puVar8;
  macro_t pmVar9;
  size_t sVar10;
  ulong uVar11;
  token_arr_t pVVar12;
  token_t *pptVar13;
  VARR_char *pVVar14;
  VARR_char *pVVar15;
  pos_t pVar16;
  gen_ctx **ppgVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  char cVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  token_t *pptVar26;
  VARR_token_t *pVVar27;
  VARR_token_t *extraout_RAX;
  c2m_ctx_t pcVar28;
  void *pvVar29;
  c2m_ctx_t pcVar30;
  MIR_context_t pMVar31;
  token_t ptVar32;
  token_t t_00;
  macro_call_t pmVar33;
  VARR_token_arr_t *pVVar34;
  token_arr_t *ppVVar35;
  gen_ctx *pgVar36;
  MIR_item_t pMVar37;
  c2m_ctx_t pcVar38;
  ulong uVar39;
  macro_call_t *ppmVar40;
  undefined1 *puVar41;
  char *pcVar42;
  char *pcVar43;
  node_t_conflict pnVar44;
  undefined4 *puVar45;
  long *plVar46;
  undefined8 *puVar47;
  uint uVar48;
  token_t *in_RCX;
  c2m_ctx_t pcVar49;
  uint uVar50;
  long *extraout_RDX;
  token_t t_01;
  char *format;
  long extraout_RDX_00;
  uint uVar51;
  c2m_ctx_t pcVar52;
  MIR_item_t pMVar53;
  c2m_ctx_t pcVar54;
  char *pcVar55;
  char **in_R8;
  long lVar56;
  token_t t_02;
  MIR_context_t pMVar57;
  c2m_ctx_t unaff_R14;
  MIR_context_t pMVar58;
  size_t sVar59;
  size_t sVar60;
  char *pcVar61;
  bool bVar62;
  str_t sVar63;
  char *pcStack_1c8;
  size_t sStack_1c0;
  MIR_context_t pMStack_130;
  uint uStack_bc;
  
  ppVar3 = c2m_ctx->pre_ctx;
  pcVar52 = (c2m_ctx_t)t;
  if (ppVar3->no_out_p == 0) {
    pcVar38 = c2m_ctx;
    if (ppVar3->macro_call_stack == (VARR_macro_call_t *)0x0) goto LAB_00192c79;
    if (ppVar3->macro_call_stack->els_num != 0) goto LAB_00192bab;
    pVVar27 = ppVar3->output_buffer;
    if (pVVar27 != (VARR_token_t *)0x0) {
      uVar25 = 0;
      do {
        in_RCX = pVVar27->varr;
        unaff_R14 = c2m_ctx;
        if (pVVar27->els_num <= uVar25) goto LAB_00192c49;
        if (in_RCX == (token_t *)0x0) {
          out_token_cold_3();
          goto LAB_00192c74;
        }
        pcVar52 = (c2m_ctx_t)in_RCX[uVar25];
        pcVar38 = c2m_ctx;
        (*ppVar3->pre_out_token_func)(c2m_ctx,(token_t)pcVar52);
        uVar25 = uVar25 + 1;
        pVVar27 = ppVar3->output_buffer;
      } while (pVVar27 != (VARR_token_t *)0x0);
    }
    out_token_cold_4();
    pVVar27 = extraout_RAX;
LAB_00192c49:
    if (in_RCX != (token_t *)0x0) {
      pVVar27->els_num = 0;
      (*ppVar3->pre_out_token_func)(unaff_R14,t);
      return;
    }
  }
  else {
LAB_00192bab:
    pVVar27 = ppVar3->output_buffer;
    pcVar38 = (c2m_ctx_t)pVVar27->varr;
    if (pcVar38 != (c2m_ctx_t)0x0) {
      uVar25 = pVVar27->els_num + 1;
      if (pVVar27->size < uVar25) {
        sVar60 = (uVar25 >> 1) + uVar25;
        pptVar26 = (token_t *)realloc(pcVar38,sVar60 * 8);
        pVVar27->varr = pptVar26;
        pVVar27->size = sVar60;
      }
      sVar60 = pVVar27->els_num;
      pVVar27->els_num = sVar60 + 1;
      pVVar27->varr[sVar60] = t;
      return;
    }
LAB_00192c74:
    out_token_cold_1();
LAB_00192c79:
    out_token_cold_5();
  }
  out_token_cold_2();
  pcVar28 = pcVar52;
  if (pcVar52 != (c2m_ctx_t)0x0) goto LAB_00192ca6;
  while( true ) {
    do {
      pcVar52 = (c2m_ctx_t)0x0;
      pcVar28 = (c2m_ctx_t)get_next_pptoken_1(pcVar38,0);
LAB_00192ca6:
      if ((*(short *)&pcVar28->ctx == 10) || (*(short *)&pcVar28->ctx == 0x147)) {
        unget_next_pptoken(pcVar38,(token_t)pcVar28);
        return;
      }
    } while (extraout_RDX == (long *)0x0);
    pcVar54 = (c2m_ctx_t)extraout_RDX[2];
    if (pcVar54 == (c2m_ctx_t)0x0) break;
    uVar25 = *extraout_RDX + 1;
    if ((ulong)extraout_RDX[1] < uVar25) {
      lVar56 = (uVar25 >> 1) + uVar25;
      pvVar29 = realloc(pcVar54,lVar56 * 8);
      extraout_RDX[2] = (long)pvVar29;
      extraout_RDX[1] = lVar56;
    }
    lVar56 = *extraout_RDX;
    *extraout_RDX = lVar56 + 1;
    *(c2m_ctx_t *)(extraout_RDX[2] + lVar56 * 8) = pcVar28;
  }
  skip_nl_cold_1();
  pVVar4 = pcVar54->pre_ctx->macro_call_stack;
  if (((pVVar4 != (VARR_macro_call_t *)0x0) && (pVVar4->varr != (macro_call_t *)0x0)) &&
     (sVar60 = pVVar4->els_num, sVar60 != 0)) {
    pVVar4->els_num = sVar60 - 1;
    pmVar33 = pVVar4->varr[sVar60 - 1];
    pmVar33->macro->ignore_p = 0;
    free_macro_call(pmVar33);
    return;
  }
  pop_macro_call_cold_1();
  pMVar5 = pcVar52->ctx;
  pcVar55 = (char *)pMVar5->error_func;
  pcVar28 = pcVar52;
  pcVar38 = pcVar54;
  if ((MIR_context_t)pcVar55 != (MIR_context_t)0x0) {
    iVar24 = *(int *)&((MIR_context_t)pcVar55)->gen_ctx;
    iVar21 = (int)pcVar52->env[0].__jmpbuf[2];
    if (iVar21 < iVar24) {
      p_Var6 = ((MIR_context_t)pcVar55)->error_func;
      uStack_bc = 0xffffffff;
      do {
        pcVar55 = (char *)(ulong)(iVar21 + 1U);
        *(uint *)(pcVar52->env[0].__jmpbuf + 2) = iVar21 + 1U;
        pcVar30 = *(c2m_ctx_t *)(p_Var6 + (long)iVar21 * 8);
        sVar1 = *(short *)&pcVar30->ctx;
        if (sVar1 == 0x103) {
          pcVar38 = (c2m_ctx_t)pMVar5->c2mir_ctx;
          pcVar49 = (c2m_ctx_t)pcVar30->env[0].__jmpbuf[3];
          uVar22 = find_param((VARR_token_t *)pcVar38,(char *)pcVar49);
          if ((int)uVar22 < 0) {
            bVar62 = false;
            goto LAB_00193440;
          }
          pcVar55 = (char *)pcVar52->env[0].__jmpbuf[1];
          if ((((MIR_context_t)pcVar55 == (MIR_context_t)0x0) ||
              (((MIR_context_t)pcVar55)->error_func == (MIR_error_func_t)0x0)) ||
             (((MIR_context_t)pcVar55)->gen_ctx <= (gen_ctx *)(ulong)uVar22)) {
LAB_001935ae:
            process_replacement_cold_19();
LAB_001935b3:
            process_replacement_cold_9();
LAB_001935b8:
            process_replacement_cold_10();
LAB_001935bd:
            process_replacement_cold_3();
LAB_001935c2:
            process_replacement_cold_7();
LAB_001935c7:
            process_replacement_cold_12();
LAB_001935cc:
            process_replacement_cold_2();
LAB_001935d1:
            process_replacement_cold_8();
            pcVar28 = pcVar49;
            goto LAB_001935d6;
          }
          pcVar49 = *(c2m_ctx_t *)(((MIR_context_t)pcVar55)->error_func + (long)(ulong)uVar22 * 8);
          if (-1 < (int)uStack_bc) {
            pcVar28 = (c2m_ctx_t)(ulong)uStack_bc;
            del_tokens((VARR_token_t *)pcVar52->env[0].__jmpbuf[3],uStack_bc,-1);
            pcVar38 = pcVar49;
            if (pcVar49 == (c2m_ctx_t)0x0) goto LAB_001935f4;
            if (pcVar49->ctx != (MIR_context_t)0x0) {
              puVar47 = (undefined8 *)pcVar49->env[0].__jmpbuf[0];
              if (puVar47 == (undefined8 *)0x0) goto LAB_001935fe;
              sVar1 = *(short *)*puVar47;
              if ((sVar1 == 0x20) || (sVar1 == 10)) {
                pcVar28 = (c2m_ctx_t)0x0;
                del_tokens((VARR_token_t *)pcVar49,0,1);
              }
            }
            pMVar31 = pcVar49->ctx;
            if (pMVar31 != (MIR_context_t)0x0) {
              pcVar55 = (char *)pcVar49->env[0].__jmpbuf[0];
              if ((MIR_context_t)pcVar55 == (MIR_context_t)0x0) goto LAB_00193603;
              uVar2 = **(ushort **)((long)pcVar55 + (long)pMVar31 * 8 + -8);
              pcVar55 = (char *)(ulong)uVar2;
              if ((uVar2 == 0x20) || (uVar2 == 10)) {
                pcVar49->ctx = (MIR_context_t)((long)&pMVar31[-1].wrapper_end_addr + 7);
              }
            }
            if (pcVar49->ctx == (MIR_context_t)0x0) {
              pMVar31 = pcVar52->ctx;
            }
            else {
              pMVar31 = (MIR_context_t)pcVar49->env[0].__jmpbuf[0];
              if (pMVar31 == (MIR_context_t)0x0) goto LAB_00193608;
            }
            pgVar36 = pMVar31->gen_ctx;
            pcVar55 = (pcVar54->empty_str).s;
            sVar60 = (pcVar54->empty_str).len;
            pVar16 = *(pos_t *)&pgVar36->optimize_level;
            pnVar44 = new_node(pcVar54,N_STR);
            add_pos(pcVar54,pnVar44,pVar16);
            (pnVar44->u).s.s = pcVar55;
            (pnVar44->u).s.len = sVar60;
            pcVar55 = *(char **)&pgVar36->optimize_level;
            pMVar53 = pgVar36->curr_func_item;
            sVar63 = uniq_cstr(pcVar54,"");
            pcVar61 = sVar63.s;
            pcVar28 = (c2m_ctx_t)0x30;
            pcVar38 = pcVar54;
            pcVar30 = (c2m_ctx_t)reg_malloc(pcVar54,0x30);
            *(undefined4 *)&pcVar30->ctx = 0x102;
            ((pos_t *)&pcVar30->options)->fname = pcVar55;
            pcVar30->env[0].__jmpbuf[0] = (long)pMVar53;
            pcVar30->env[0].__jmpbuf[3] = (long)pcVar61;
            *(undefined4 *)(pcVar30->env[0].__jmpbuf + 1) = 0;
            pcVar30->env[0].__jmpbuf[2] = (long)pnVar44;
            pcVar55 = (char *)pcVar54->temp_string;
            if (((MIR_context_t)pcVar55 != (MIR_context_t)0x0) &&
               (((MIR_context_t)pcVar55)->error_func != (MIR_error_func_t)0x0)) {
              ((MIR_context_t)pcVar55)->gen_ctx = (gen_ctx *)0x0;
              cVar20 = *pcVar61;
              while (cVar20 != '\0') {
                pcVar61 = pcVar61 + 1;
                pVVar14 = pcVar54->temp_string;
                pcVar38 = (c2m_ctx_t)pVVar14->varr;
                if (pcVar38 == (c2m_ctx_t)0x0) goto LAB_001935c2;
                uVar25 = pVVar14->els_num + 1;
                if (pVVar14->size < uVar25) {
                  sVar59 = (uVar25 >> 1) + uVar25;
                  pcVar55 = (char *)realloc(pcVar38,sVar59);
                  pVVar14->varr = pcVar55;
                  pVVar14->size = sVar59;
                }
                sVar60 = pVVar14->els_num;
                pcVar55 = pVVar14->varr;
                pVVar14->els_num = sVar60 + 1;
                *(char *)((long)&((MIR_context_t)pcVar55)->gen_ctx + sVar60) = cVar20;
                cVar20 = *pcVar61;
              }
              pVVar14 = pcVar54->temp_string;
              pcVar38 = (c2m_ctx_t)pVVar14->varr;
              if (pcVar38 != (c2m_ctx_t)0x0) {
                uVar25 = pVVar14->els_num + 1;
                if (pVVar14->size < uVar25) {
                  sVar59 = (uVar25 >> 1) + uVar25;
                  pcVar55 = (char *)realloc(pcVar38,sVar59);
                  pVVar14->varr = pcVar55;
                  pVVar14->size = sVar59;
                }
                sVar60 = pVVar14->els_num;
                pcVar55 = pVVar14->varr;
                pVVar14->els_num = sVar60 + 1;
                *(undefined1 *)((long)&((MIR_context_t)pcVar55)->gen_ctx + sVar60) = 0x22;
                if (pcVar49->ctx != (MIR_context_t)0x0) {
                  pMVar31 = (MIR_context_t)0x0;
                  do {
                    lVar56 = pcVar49->env[0].__jmpbuf[0];
                    if (lVar56 == 0) goto LAB_001935c7;
                    puVar8 = *(ushort **)(lVar56 + (long)pMVar31 * 8);
                    uVar2 = *puVar8;
                    pcVar55 = (char *)(ulong)uVar2;
                    if ((uVar2 == 0x20) || (uVar2 == 10)) {
                      pVVar14 = pcVar54->temp_string;
                      pcVar38 = (c2m_ctx_t)pVVar14->varr;
                      if (pcVar38 == (c2m_ctx_t)0x0) goto LAB_001935d1;
                      uVar25 = pVVar14->els_num + 1;
                      if (pVVar14->size < uVar25) {
                        sVar59 = (uVar25 >> 1) + uVar25;
                        pcVar55 = (char *)realloc(pcVar38,sVar59);
                        pVVar14->varr = pcVar55;
                        pVVar14->size = sVar59;
                      }
                      sVar60 = pVVar14->els_num;
                      pcVar55 = pVVar14->varr;
                      pVVar14->els_num = sVar60 + 1;
                      *(undefined1 *)((long)&((MIR_context_t)pcVar55)->gen_ctx + sVar60) = 0x20;
                    }
                    else {
                      pcVar61 = *(char **)(puVar8 + 0x14);
                      cVar20 = *pcVar61;
                      if (cVar20 != '\0') {
                        pMVar58 = (MIR_context_t)((long)&pMVar31->gen_ctx + 1);
                        do {
                          pcVar55 = (char *)0x0;
                          if (pcVar49->ctx != pMVar58) {
                            if ((pcVar49->ctx <= pMVar58) ||
                               (pcVar55 = (char *)pcVar49->env[0].__jmpbuf[0],
                               (MIR_context_t)pcVar55 == (MIR_context_t)0x0)) goto LAB_001935b3;
                            pcVar55 = (char *)(ulong)(uint)(int)**(char **)((&((MIR_context_t)
                                                                              pcVar55)->c2mir_ctx)
                                                                            [(long)pMVar31] + 0x28);
                          }
                          if (cVar20 == '\"') {
LAB_00193278:
                            pVVar14 = pcVar54->temp_string;
                            pcVar38 = (c2m_ctx_t)pVVar14->varr;
                            if (pcVar38 == (c2m_ctx_t)0x0) goto LAB_001935b8;
                            uVar25 = pVVar14->els_num + 1;
                            if (pVVar14->size < uVar25) {
                              sVar59 = (uVar25 >> 1) + uVar25;
                              pcVar55 = (char *)realloc(pcVar38,sVar59);
                              pVVar14->varr = pcVar55;
                              pVVar14->size = sVar59;
                            }
                            sVar60 = pVVar14->els_num;
                            pcVar55 = pVVar14->varr;
                            pVVar14->els_num = sVar60 + 1;
                            *(undefined1 *)((long)&((MIR_context_t)pcVar55)->gen_ctx + sVar60) =
                                 0x5c;
                          }
                          else if (cVar20 == '\\') {
                            uVar22 = (uint)pcVar55;
                            if (((0x37 < uVar22 - 0x3f) ||
                                ((0xa880cc20000001U >> ((ulong)(uVar22 - 0x3f) & 0x3f) & 1) == 0))
                               && (bVar62 = (uVar22 & 0xfffffff8) == 0x30,
                                  uVar22 = uVar22 & 0xffffffdf,
                                  pcVar55 = (char *)(ulong)CONCAT31((int3)(uVar22 >> 8),
                                                                    uVar22 == 0x58 || bVar62),
                                  uVar22 != 0x58 && !bVar62)) goto LAB_00193278;
                          }
                          pVVar14 = pcVar54->temp_string;
                          pcVar38 = (c2m_ctx_t)pVVar14->varr;
                          if (pcVar38 == (c2m_ctx_t)0x0) {
                            process_replacement_cold_11();
                            goto LAB_001935ae;
                          }
                          cVar20 = *pcVar61;
                          uVar25 = pVVar14->els_num + 1;
                          if (pVVar14->size < uVar25) {
                            sVar59 = (uVar25 >> 1) + uVar25;
                            pcVar55 = (char *)realloc(pcVar38,sVar59);
                            pVVar14->varr = pcVar55;
                            pVVar14->size = sVar59;
                          }
                          sVar60 = pVVar14->els_num;
                          pcVar55 = pVVar14->varr;
                          pVVar14->els_num = sVar60 + 1;
                          *(char *)((long)&((MIR_context_t)pcVar55)->gen_ctx + sVar60) = cVar20;
                          cVar20 = pcVar61[1];
                          pcVar61 = pcVar61 + 1;
                        } while (cVar20 != '\0');
                      }
                    }
                    pMVar31 = (MIR_context_t)((long)&pMVar31->gen_ctx + 1);
                  } while (pMVar31 < pcVar49->ctx);
                }
                pVVar14 = pcVar54->temp_string;
                pcVar38 = (c2m_ctx_t)pVVar14->varr;
                if (pcVar38 != (c2m_ctx_t)0x0) {
                  uVar25 = pVVar14->els_num + 1;
                  if (pVVar14->size < uVar25) {
                    pcVar28 = (c2m_ctx_t)((uVar25 >> 1) + uVar25);
                    pcVar49 = pcVar28;
                    pcVar55 = (char *)realloc(pcVar38,(size_t)pcVar28);
                    pVVar14->varr = pcVar55;
                    pVVar14->size = (size_t)pcVar28;
                  }
                  sVar60 = pVVar14->els_num;
                  pcVar55 = pVVar14->varr;
                  pVVar14->els_num = sVar60 + 1;
                  *(undefined1 *)((long)&((MIR_context_t)pcVar55)->gen_ctx + sVar60) = 0x22;
                  pVVar14 = pcVar54->temp_string;
                  pcVar38 = (c2m_ctx_t)pVVar14->varr;
                  if (pcVar38 != (c2m_ctx_t)0x0) {
                    uVar25 = pVVar14->els_num + 1;
                    if (pVVar14->size < uVar25) {
                      pcVar28 = (c2m_ctx_t)((uVar25 >> 1) + uVar25);
                      pcVar49 = pcVar28;
                      pcVar55 = (char *)realloc(pcVar38,(size_t)pcVar28);
                      pVVar14->varr = pcVar55;
                      pVVar14->size = (size_t)pcVar28;
                    }
                    sVar60 = pVVar14->els_num;
                    pcVar55 = pVVar14->varr;
                    pVVar14->els_num = sVar60 + 1;
                    *(undefined1 *)((long)&((MIR_context_t)pcVar55)->gen_ctx + sVar60) = 0;
                    if (pcVar54->temp_string != (VARR_char *)0x0) {
                      sVar63 = uniq_cstr(pcVar54,pcVar54->temp_string->varr);
                      pcVar30->env[0].__jmpbuf[3] = (long)sVar63.s;
                      set_string_val(pcVar54,(token_t)pcVar30,pcVar54->temp_string,0x20);
                      bVar62 = true;
                      goto LAB_00193440;
                    }
                    goto LAB_001935ef;
                  }
                  goto LAB_001935f9;
                }
                goto LAB_001935ea;
              }
              goto LAB_001935e5;
            }
            goto LAB_001935db;
          }
          iVar21 = (int)pcVar52->env[0].__jmpbuf[2];
          lVar56 = (long)iVar21;
          if (((((lVar56 < 2) ||
                (pcVar55 = *(char **)(p_Var6 + lVar56 * 8 + -0x10),
                *(short *)&((MIR_context_t)pcVar55)->gen_ctx != 0x142)) &&
               ((iVar21 < 3 ||
                ((**(short **)(p_Var6 + lVar56 * 8 + -0x10) != 0x20 ||
                 (pcVar55 = *(char **)(p_Var6 + lVar56 * 8 + -0x18),
                 *(short *)&((MIR_context_t)pcVar55)->gen_ctx != 0x142)))))) &&
              ((iVar24 <= iVar21 ||
               (pcVar55 = *(char **)(p_Var6 + lVar56 * 8),
               *(short *)&((MIR_context_t)pcVar55)->gen_ctx != 0x142)))) &&
             (((iVar24 <= iVar21 + 1 ||
               (pcVar55 = *(char **)(p_Var6 + (long)(iVar21 + 1) * 8),
               *(short *)&((MIR_context_t)pcVar55)->gen_ctx != 0x142)) ||
              (**(short **)(p_Var6 + lVar56 * 8) != 0x20)))) {
            pcVar55 = ((pos_t *)&pcVar30->options)->fname;
            uVar18 = *(undefined4 *)(pcVar30->env[0].__jmpbuf + 0);
            uVar19 = *(undefined4 *)((long)(pcVar30->env[0].__jmpbuf + 0) + 4);
            ptVar32 = (token_t)reg_malloc(pcVar54,0x30);
            *(undefined4 *)ptVar32 = 0x144;
            (ptVar32->pos).fname = pcVar55;
            (ptVar32->pos).lno = uVar18;
            (ptVar32->pos).ln_pos = uVar19;
            ptVar32->repr = "";
            ptVar32->node_code = N_IGNORE;
            ptVar32->node = (node_t_conflict)0x0;
            unget_next_pptoken(pcVar54,ptVar32);
            copy_and_push_back(pcVar54,(VARR_token_t *)pcVar49,*(pos_t *)&pcVar52->options);
            pcVar55 = ((pos_t *)&pcVar30->options)->fname;
            uVar18 = *(undefined4 *)(pcVar30->env[0].__jmpbuf + 0);
            uVar19 = *(undefined4 *)((long)(pcVar30->env[0].__jmpbuf + 0) + 4);
            ptVar32 = (token_t)reg_malloc(pcVar54,0x30);
            *(undefined4 *)ptVar32 = 0x143;
            (ptVar32->pos).fname = pcVar55;
            (ptVar32->pos).lno = uVar18;
            (ptVar32->pos).ln_pos = uVar19;
            ptVar32->repr = "";
            ptVar32->node_code = N_IGNORE;
            ptVar32->node = (node_t_conflict)0x0;
            unget_next_pptoken(pcVar54,ptVar32);
            return;
          }
          if (pcVar49 == (c2m_ctx_t)0x0) goto LAB_001935bd;
          if (pcVar49->ctx == (MIR_context_t)0x1) {
            puVar47 = (undefined8 *)pcVar49->env[0].__jmpbuf[0];
            if (puVar47 == (undefined8 *)0x0) goto LAB_001935cc;
            sVar1 = *(short *)*puVar47;
            if ((sVar1 == 0x20) || (sVar1 == 10)) goto LAB_00192ee5;
          }
          else if (pcVar49->ctx == (MIR_context_t)0x0) {
LAB_00192ee5:
            pcVar55 = ((pos_t *)&pcVar30->options)->fname;
            lVar56 = pcVar30->env[0].__jmpbuf[0];
            pcVar30 = (c2m_ctx_t)reg_malloc(pcVar54,0x30);
            *(undefined4 *)&pcVar30->ctx = 0x141;
            ((pos_t *)&pcVar30->options)->fname = pcVar55;
            pcVar30->env[0].__jmpbuf[0] = lVar56;
            pcVar30->env[0].__jmpbuf[3] = (long)"";
            *(undefined4 *)(pcVar30->env[0].__jmpbuf + 1) = 0;
            pcVar30->env[0].__jmpbuf[2] = 0;
            bVar62 = true;
            goto LAB_00193440;
          }
          pcVar38 = (c2m_ctx_t)pcVar52->env[0].__jmpbuf[3];
          add_tokens((VARR_token_t *)pcVar38,(VARR_token_t *)pcVar49);
        }
        else {
          if (sVar1 != 0x20) {
            if (sVar1 == 0x23) {
              puVar7 = (uint *)pcVar52->env[0].__jmpbuf[3];
              pcVar49 = pcVar30;
              if (puVar7 == (uint *)0x0) goto LAB_001935e0;
              uStack_bc = *puVar7;
            }
            else {
              uStack_bc = 0xffffffff;
            }
          }
          bVar62 = false;
LAB_00193440:
          if (!bVar62) {
            pcVar30 = (c2m_ctx_t)copy_token(pcVar54,(token_t)pcVar30,*(pos_t *)&pcVar52->options);
          }
          pcVar38 = (c2m_ctx_t)pcVar52->env[0].__jmpbuf[3];
          add_token((VARR_token_t *)pcVar38,(token_t)pcVar30);
        }
        iVar21 = (int)pcVar52->env[0].__jmpbuf[2];
      } while (iVar21 < iVar24);
    }
    ptVar32 = get_next_pptoken_1(pcVar54,0);
    unget_next_pptoken(pcVar54,ptVar32);
    pcVar55 = (ptVar32->pos).fname;
    iVar24 = (ptVar32->pos).lno;
    iVar21 = (ptVar32->pos).ln_pos;
    ptVar32 = (token_t)reg_malloc(pcVar54,0x30);
    *(undefined4 *)ptVar32 = 0x145;
    (ptVar32->pos).fname = pcVar55;
    (ptVar32->pos).lno = iVar24;
    (ptVar32->pos).ln_pos = iVar21;
    ptVar32->repr = "";
    ptVar32->node_code = N_IGNORE;
    ptVar32->node = (node_t_conflict)0x0;
    unget_next_pptoken(pcVar54,ptVar32);
    pVVar27 = (VARR_token_t *)pcVar52->env[0].__jmpbuf[3];
    do_concat(pcVar54,pVVar27);
    push_back(pcVar54,pVVar27);
    pMVar5->func_redef_permission_p = 1;
    return;
  }
LAB_001935d6:
  process_replacement_cold_20();
LAB_001935db:
  process_replacement_cold_17();
  pcVar49 = pcVar28;
LAB_001935e0:
  process_replacement_cold_1();
LAB_001935e5:
  process_replacement_cold_16();
LAB_001935ea:
  process_replacement_cold_15();
LAB_001935ef:
  process_replacement_cold_13();
  pcVar28 = pcVar49;
LAB_001935f4:
  pcVar49 = pcVar28;
  process_replacement_cold_18();
LAB_001935f9:
  process_replacement_cold_14();
  pcVar28 = pcVar49;
  pcVar49 = pcVar38;
LAB_001935fe:
  process_replacement_cold_4();
LAB_00193603:
  process_replacement_cold_5();
LAB_00193608:
  process_replacement_cold_6();
  ppVar3 = pcVar49->pre_ctx;
  while( true ) {
    ptVar32 = get_next_pptoken_1(pcVar49,0);
    sVar1 = *(short *)ptVar32;
    if (sVar1 != 0x145) break;
    pop_macro_call(pcVar49);
  }
  if ((sVar1 == 10) || (sVar1 == 0x20)) {
    t_00 = get_next_pptoken_1(pcVar49,0);
    t_02 = ptVar32;
  }
  else {
    t_02 = (token_t)0x0;
    t_00 = ptVar32;
  }
  if (*(short *)t_00 != 0x28) {
    unget_next_pptoken(pcVar49,t_00);
    if (t_02 != (token_t)0x0) {
      unget_next_pptoken(pcVar49,t_02);
    }
    out_token(pcVar49,t_01);
    return;
  }
  pcVar52 = (c2m_ctx_t)(t_01->pos).fname;
  pmVar33 = new_macro_call((macro_t)pcVar28,t_01->pos);
  pmVar9 = pmVar33->macro;
  pMVar53 = (MIR_item_t)&DAT_00000018;
  pVVar34 = (VARR_token_arr_t *)malloc(0x18);
  if (pVVar34 == (VARR_token_arr_t *)0x0) {
LAB_00193c1e:
    mir_varr_error((char *)pMVar53);
  }
  pVVar34->els_num = 0;
  pVVar34->size = 0x10;
  ppVVar35 = (token_arr_t *)malloc(0x80);
  pVVar34->varr = ppVVar35;
  pMVar53 = (MIR_item_t)&DAT_00000018;
  pgVar36 = (gen_ctx *)malloc(0x18);
  if (pgVar36 == (gen_ctx *)0x0) goto LAB_00193c1e;
  pgVar36->ctx = (MIR_context_t)0x0;
  ((pos_t *)&pgVar36->optimize_level)->fname = (char *)0x10;
  pMVar53 = (MIR_item_t)0x80;
  pMVar37 = (MIR_item_t)malloc(0x80);
  pgVar36->curr_func_item = pMVar37;
  pVVar27 = pmVar9->params;
  if (pVVar27 == (VARR_token_t *)0x0) {
LAB_00193c37:
    try_param_macro_call_cold_17();
LAB_00193c3c:
    try_param_macro_call_cold_15();
    goto LAB_00193c41;
  }
  uVar25 = pVVar27->els_num;
  uVar51 = 0;
  uVar22 = 0;
  if (uVar25 != 1) {
LAB_00193740:
    bVar62 = false;
    do {
      pcVar52 = (c2m_ctx_t)0x0;
      pcVar38 = (c2m_ctx_t)get_next_pptoken_1(pcVar49,0);
      if (*(short *)&pcVar38->ctx == 0x145) {
        pcVar52 = (c2m_ctx_t)0x0;
        pcVar38 = (c2m_ctx_t)get_next_pptoken_1(pcVar49,0);
        pop_macro_call(pcVar49);
      }
      uVar23 = *(uint *)&pcVar38->ctx & 0xffff;
      uVar48 = *(uint *)&pcVar38->ctx * 0x10000;
      pcVar55 = (char *)(ulong)uVar48;
      uVar50 = uVar48 + 0xfec30000 >> 0x10;
      if ((((uVar50 < 0xb) && (pcVar52 = (c2m_ctx_t)0x5c1, (0x5c1U >> (uVar50 & 0x1f) & 1) != 0)) ||
          (pcVar55 = (char *)(ulong)CONCAT31((int3)(uVar48 >> 8),uVar48 == 0x230000),
          (bool)(bVar62 & uVar48 == 0x230000))) ||
         (uVar48 = uVar23 ^ 0x29 | uVar51, pcVar55 = (char *)(ulong)uVar48, uVar48 == 0)) {
        if (uVar23 != 0x29) {
          in_R8 = (char **)pmVar9->id->repr;
          pcVar55 = "unfinished call of macro %s";
          error(pcVar49,0x1c3620,(char *)pcVar38->options,pcVar38->env[0].__jmpbuf[0]);
          pcVar52 = pcVar38;
          unget_next_pptoken(pcVar49,(token_t)pcVar38);
        }
        pMVar53 = (MIR_item_t)pVVar34->varr;
        if (pMVar53 == (MIR_item_t)0x0) goto LAB_00193c3c;
        uVar39 = pVVar34->els_num + 1;
        if (pVVar34->size < uVar39) {
          sVar60 = (uVar39 >> 1) + uVar39;
          pcVar52 = (c2m_ctx_t)(sVar60 * 8);
          ppVVar35 = (token_arr_t *)realloc(pMVar53,(size_t)pcVar52);
          pVVar34->varr = ppVVar35;
          pVVar34->size = sVar60;
        }
        uVar11 = pVVar34->els_num;
        uVar39 = uVar11 + 1;
        pVVar34->els_num = uVar39;
        pVVar34->varr[uVar11] = (token_arr_t)pgVar36;
        pcVar55 = (char *)(uVar11 | uVar25);
        if ((MIR_context_t)pcVar55 == (MIR_context_t)0x0) {
          pcVar55 = (char *)pVVar34->varr;
          if ((MIR_context_t)pcVar55 == (MIR_context_t)0x0) goto LAB_00193c55;
          pgVar36 = ((MIR_context_t)pcVar55)->gen_ctx;
          if (pgVar36 == (gen_ctx *)0x0) goto LAB_00193c5a;
          pcVar52 = (c2m_ctx_t)pgVar36->ctx;
          if (pcVar52 == (c2m_ctx_t)0x0) {
LAB_00193b7d:
            pVVar34->els_num = uVar11;
            pgVar36 = (&((MIR_context_t)pcVar55)->gen_ctx)[uVar11];
            if ((pgVar36 == (gen_ctx *)0x0) ||
               (pMVar53 = pgVar36->curr_func_item, pMVar53 == (MIR_item_t)0x0)) goto LAB_00193c5f;
            free(pMVar53);
            free(pgVar36);
            goto LAB_00193ba7;
          }
          if (pcVar52 == (c2m_ctx_t)&DAT_00000001) {
            if (pgVar36->curr_func_item == (MIR_item_t)0x0) goto LAB_00193c69;
            if (*pgVar36->curr_func_item->data == 0x20) goto LAB_00193b7d;
          }
        }
        if (uVar39 <= uVar25) {
          if (uVar25 <= uVar39) goto LAB_00193ba7;
          pMStack_130 = (MIR_context_t)0x1c365f;
          goto LAB_00193a8a;
        }
        if (pVVar34->varr == (token_arr_t *)0x0) goto LAB_00193c4b;
        pVVar12 = pVVar34->varr[uVar25];
        if (pVVar12 == (token_arr_t)0x0) goto LAB_00193c50;
        if (pVVar12->els_num != 0) {
          if (pVVar12->varr == (token_t *)0x0) goto LAB_00193c64;
          pcVar38 = (c2m_ctx_t)*pVVar12->varr;
        }
        pMStack_130 = (MIR_context_t)0x1c363c;
        goto LAB_00193a2f;
      }
      pcVar55 = (char *)(ulong)(uVar51 | uVar22);
      if (uVar23 == 0x2c && (uVar51 | uVar22) == 0) {
        pMVar53 = (MIR_item_t)pVVar34->varr;
        if (pMVar53 == (MIR_item_t)0x0) goto LAB_00193c32;
        uVar39 = pVVar34->els_num + 1;
        if (pVVar34->size < uVar39) {
          sVar60 = (uVar39 >> 1) + uVar39;
          pcVar52 = (c2m_ctx_t)(sVar60 * 8);
          ppVVar35 = (token_arr_t *)realloc(pMVar53,(size_t)pcVar52);
          pVVar34->varr = ppVVar35;
          pVVar34->size = sVar60;
        }
        sVar10 = pVVar34->els_num;
        pcVar55 = (char *)pVVar34->varr;
        sVar60 = sVar10 + 1;
        pVVar34->els_num = sVar60;
        (&((MIR_context_t)pcVar55)->gen_ctx)[sVar10] = pgVar36;
        pMVar53 = (MIR_item_t)&DAT_00000018;
        pgVar36 = (gen_ctx *)malloc(0x18);
        if (pgVar36 == (gen_ctx *)0x0) goto LAB_00193c1e;
        pgVar36->ctx = (MIR_context_t)0x0;
        ((pos_t *)&pgVar36->optimize_level)->fname = (char *)0x10;
        pMVar53 = (MIR_item_t)0x80;
        pMVar37 = (MIR_item_t)malloc(0x80);
        pgVar36->curr_func_item = pMVar37;
        uVar51 = 0;
        if (sVar60 == uVar25 - 1) {
          pVVar27 = pmVar9->params;
          if (((pVVar27 == (VARR_token_t *)0x0) ||
              (pcVar55 = (char *)pVVar27->varr, (MIR_context_t)pcVar55 == (MIR_context_t)0x0)) ||
             (pVVar27->els_num <= uVar25 - 1)) goto LAB_00193c28;
          iVar24 = strcmp(*(char **)(*(long *)((long)pcVar55 + uVar25 * 8 + -8) + 0x28),"...");
          uVar22 = (uint)(iVar24 == 0);
        }
        else {
          uVar22 = 0;
        }
      }
      else {
        pMVar53 = pgVar36->curr_func_item;
        if (pMVar53 == (MIR_item_t)0x0) goto LAB_00193c2d;
        pcVar55 = (char *)((long)&pgVar36->ctx->gen_ctx + 1);
        if (((pos_t *)&pgVar36->optimize_level)->fname < pcVar55) {
          pMVar53 = (MIR_item_t)realloc(pMVar53,(long)(pcVar55 + ((ulong)pcVar55 >> 1)) * 8);
          pgVar36->curr_func_item = pMVar53;
          ((pos_t *)&pgVar36->optimize_level)->fname = pcVar55 + ((ulong)pcVar55 >> 1);
        }
        pMVar5 = pgVar36->ctx;
        pgVar36->ctx = (MIR_context_t)((long)&pMVar5->gen_ctx + 1);
        (&pgVar36->curr_func_item->data)[(long)pMVar5] = pcVar38;
        if (*(short *)&pcVar38->ctx == 0x28) {
          uVar51 = uVar51 + 1;
        }
        else if (*(short *)&pcVar38->ctx == 0x29) {
          uVar51 = uVar51 - 1;
        }
      }
      bVar62 = *(short *)&pcVar38->ctx == 10;
    } while( true );
  }
  if (pVVar27->varr != (token_t *)0x0) {
    uVar22 = (uint)(*(short *)*pVVar27->varr == 0x10f);
    goto LAB_00193740;
  }
  goto LAB_00193c46;
LAB_00193a8a:
  pMVar53 = (MIR_item_t)&DAT_00000018;
  pgVar36 = (gen_ctx *)malloc(0x18);
  if (pgVar36 != (gen_ctx *)0x0) {
    pgVar36->ctx = (MIR_context_t)0x0;
    ((pos_t *)&pgVar36->optimize_level)->fname = (char *)0x10;
    pMVar53 = (MIR_item_t)malloc(0x80);
    pgVar36->curr_func_item = pMVar53;
    pMVar53 = (MIR_item_t)pVVar34->varr;
    if (pMVar53 != (MIR_item_t)0x0) goto code_r0x00193aca;
    try_param_macro_call_cold_6();
LAB_00193c28:
    try_param_macro_call_cold_2();
LAB_00193c2d:
    try_param_macro_call_cold_1();
LAB_00193c32:
    try_param_macro_call_cold_3();
    goto LAB_00193c37;
  }
  goto LAB_00193c1e;
code_r0x00193aca:
  uVar39 = uVar39 + 1;
  if (pVVar34->size < uVar39) {
    sVar60 = (uVar39 >> 1) + uVar39;
    pcVar52 = (c2m_ctx_t)(sVar60 * 8);
    ppVVar35 = (token_arr_t *)realloc(pMVar53,(size_t)pcVar52);
    pVVar34->varr = ppVVar35;
    pVVar34->size = sVar60;
  }
  sVar60 = pVVar34->els_num;
  pcVar55 = (char *)pVVar34->varr;
  uVar39 = sVar60 + 1;
  pVVar34->els_num = uVar39;
  (&((MIR_context_t)pcVar55)->gen_ctx)[sVar60] = pgVar36;
  if (uVar25 <= uVar39) goto LAB_00193b11;
  goto LAB_00193a8a;
  while( true ) {
    ppgVar17 = &pMVar57->gen_ctx;
    pMVar57 = (MIR_context_t)((long)&pMVar57->gen_ctx + 1);
    if (pptVar26[(long)((long)ppgVar17 + 1)]->node_code == N_GT) break;
LAB_00193d8d:
    pcVar28 = (c2m_ctx_t)((long)pcVar54->env[0].__jmpbuf + (long)&pMVar57[-1].setjmp_addr);
    if (pcVar28 == (c2m_ctx_t)&DAT_00000001) goto LAB_0019413a;
  }
  pcVar28 = (c2m_ctx_t)
            CONCAT71((int7)((ulong)pptVar26[(long)((long)ppgVar17 + 1)] >> 8),pMVar57 < pMVar5);
LAB_00193db0:
  if ((char)pcVar28 == '\0') goto LAB_0019413a;
  pVVar14 = pcVar38->symbol_text;
  if ((pVVar14 == (VARR_char *)0x0) ||
     (pcVar54 = (c2m_ctx_t)pVVar14->varr, pcVar54 == (c2m_ctx_t)0x0)) goto LAB_001941ef;
  pVVar14->els_num = 0;
  pVVar15 = pcVar38->temp_string;
  if ((pVVar15 == (VARR_char *)0x0) || (pVVar15->varr == (char *)0x0)) goto LAB_001941f4;
  pVVar15->els_num = 0;
  uVar25 = pVVar14->els_num + 1;
  if (pVVar14->size < uVar25) {
    pcVar30 = (c2m_ctx_t)((uVar25 >> 1) + uVar25);
    pcVar28 = pcVar30;
    pcVar42 = (char *)realloc(pcVar54,(size_t)pcVar30);
    pVVar14->varr = pcVar42;
    pVVar14->size = (size_t)pcVar30;
  }
  sVar60 = pVVar14->els_num;
  pVVar14->els_num = sVar60 + 1;
  pVVar14->varr[sVar60] = '<';
  if (pMVar58 < pMVar57) {
    do {
      lVar56 = pcVar52->env[0].__jmpbuf[0];
      if ((lVar56 == 0) || (pcVar52->ctx <= pMVar58)) goto LAB_001941ea;
      pcVar42 = *(char **)(*(long *)(lVar56 + (long)pMVar58 * 8) + 0x28);
      cVar20 = *pcVar42;
      while (cVar20 != '\0') {
        pVVar14 = pcVar38->symbol_text;
        pcVar54 = (c2m_ctx_t)pVVar14->varr;
        if (pcVar54 == (c2m_ctx_t)0x0) {
LAB_001941d1:
          get_header_name_cold_2();
          goto LAB_001941d6;
        }
        uVar25 = pVVar14->els_num + 1;
        if (pVVar14->size < uVar25) {
          pcVar30 = (c2m_ctx_t)((uVar25 >> 1) + uVar25);
          pcVar28 = pcVar30;
          pcVar43 = (char *)realloc(pcVar54,(size_t)pcVar30);
          pVVar14->varr = pcVar43;
          pVVar14->size = (size_t)pcVar30;
        }
        sVar60 = pVVar14->els_num;
        pVVar14->els_num = sVar60 + 1;
        pVVar14->varr[sVar60] = cVar20;
        pVVar14 = pcVar38->temp_string;
        pcVar54 = (c2m_ctx_t)pVVar14->varr;
        if (pcVar54 == (c2m_ctx_t)0x0) {
          get_header_name_cold_1();
          goto LAB_001941d1;
        }
        cVar20 = *pcVar42;
        uVar25 = pVVar14->els_num + 1;
        if (pVVar14->size < uVar25) {
          pcVar30 = (c2m_ctx_t)((uVar25 >> 1) + uVar25);
          pcVar28 = pcVar30;
          pcVar43 = (char *)realloc(pcVar54,(size_t)pcVar30);
          pVVar14->varr = pcVar43;
          pVVar14->size = (size_t)pcVar30;
        }
        sVar60 = pVVar14->els_num;
        pVVar14->els_num = sVar60 + 1;
        pVVar14->varr[sVar60] = cVar20;
        cVar20 = pcVar42[1];
        pcVar42 = pcVar42 + 1;
      }
      pMVar58 = (MIR_context_t)((long)&pMVar58->gen_ctx + 1);
    } while (pMVar58 != pMVar57);
  }
  pVVar14 = pcVar38->symbol_text;
  pcVar54 = (c2m_ctx_t)pVVar14->varr;
  if (pcVar54 == (c2m_ctx_t)0x0) goto LAB_001941fe;
  uVar25 = pVVar14->els_num + 1;
  if (pVVar14->size < uVar25) {
    pcVar30 = (c2m_ctx_t)((uVar25 >> 1) + uVar25);
    pcVar28 = pcVar30;
    pcVar42 = (char *)realloc(pcVar54,(size_t)pcVar30);
    pVVar14->varr = pcVar42;
    pVVar14->size = (size_t)pcVar30;
  }
  sVar60 = pVVar14->els_num;
  pVVar14->els_num = sVar60 + 1;
  pVVar14->varr[sVar60] = '>';
  pVVar14 = pcVar38->symbol_text;
  pcVar54 = (c2m_ctx_t)pVVar14->varr;
  if (pcVar54 == (c2m_ctx_t)0x0) goto LAB_00194203;
  uVar25 = pVVar14->els_num + 1;
  if (pVVar14->size < uVar25) {
    pcVar30 = (c2m_ctx_t)((uVar25 >> 1) + uVar25);
    pcVar28 = pcVar30;
    pcVar42 = (char *)realloc(pcVar54,(size_t)pcVar30);
    pVVar14->varr = pcVar42;
    pVVar14->size = (size_t)pcVar30;
  }
  sVar60 = pVVar14->els_num;
  pVVar14->els_num = sVar60 + 1;
  pVVar14->varr[sVar60] = '\0';
  pVVar14 = pcVar38->temp_string;
  pcVar54 = (c2m_ctx_t)pVVar14->varr;
  if (pcVar54 == (c2m_ctx_t)0x0) goto LAB_00194208;
  uVar25 = pVVar14->els_num + 1;
  if (pVVar14->size < uVar25) {
    sVar59 = (uVar25 >> 1) + uVar25;
    pcVar42 = (char *)realloc(pcVar54,sVar59);
    pVVar14->varr = pcVar42;
    pVVar14->size = sVar59;
  }
  sVar60 = pVVar14->els_num;
  pVVar14->els_num = sVar60 + 1;
  pVVar14->varr[sVar60] = '\0';
  pcVar28 = (c2m_ctx_t)((ulong)pMVar31 & 0xffffffff);
  pcVar54 = pcVar52;
  del_tokens((VARR_token_t *)pcVar52,(int)pMVar31,(int)pMVar57 - (int)pMVar31);
  if (pcVar38->symbol_text != (VARR_char *)0x0) {
    if (pcVar38->temp_string == (VARR_char *)0x0) goto LAB_00194212;
    pcVar42 = pcVar38->symbol_text->varr;
    sVar63 = uniq_cstr(pcVar38,pcVar38->temp_string->varr);
    pnVar44 = new_node(pcVar38,N_STR);
    add_pos(pcVar38,pnVar44,pVar16);
    pcStack_1c8 = sVar63.s;
    (pnVar44->u).l = (mir_long)pcStack_1c8;
    sStack_1c0 = sVar63.len;
    (pnVar44->u).s.len = sStack_1c0;
    sVar63 = uniq_cstr(pcVar38,pcVar42);
    pcVar28 = (c2m_ctx_t)0x30;
    pcVar54 = pcVar38;
    puVar45 = (undefined4 *)reg_malloc(pcVar38,0x30);
    *puVar45 = 0x13e;
    *(char **)(puVar45 + 2) = pcVar61;
    *(token_t **)(puVar45 + 4) = pptVar13;
    *(char **)(puVar45 + 10) = sVar63.s;
    puVar45[6] = 0;
    *(node_t_conflict *)(puVar45 + 8) = pnVar44;
    lVar56 = pcVar52->env[0].__jmpbuf[0];
    if ((lVar56 != 0) && (pMVar31 < pcVar52->ctx)) {
      *(undefined4 **)(lVar56 + (long)pMVar31 * 8) = puVar45;
      goto LAB_0019413a;
    }
    goto LAB_001941f9;
  }
  goto LAB_0019420d;
  while( true ) {
    pVVar34->els_num = uVar39 - 1;
    pMVar37 = (MIR_item_t)pVVar34->varr[uVar39 - 1];
    if ((pMVar37 == (MIR_item_t)0x0) ||
       (pMVar53 = (pMVar37->item_link).prev, pMVar53 == (MIR_item_t)0x0)) {
      try_param_macro_call_cold_9();
      goto LAB_00193c19;
    }
    free(pMVar53);
    free(pMVar37);
    uVar39 = pVVar34->els_num;
    pMVar53 = pMVar37;
    if (uVar39 <= uVar25) break;
LAB_00193a2f:
    if (pVVar34->varr == (token_arr_t *)0x0) {
LAB_00193c19:
      try_param_macro_call_cold_10();
      goto LAB_00193c1e;
    }
  }
LAB_00193b11:
  in_R8 = (char **)pmVar9->id->repr;
  pcVar52 = (c2m_ctx_t)((pos_t *)&pcVar38->options)->fname;
  error(pcVar49,pMStack_130,(char *)pcVar52,pcVar38->env[0].__jmpbuf[0]);
  pcVar55 = (char *)pMStack_130;
LAB_00193ba7:
  pmVar33->args = pVVar34;
  pVVar4 = ppVar3->macro_call_stack;
  pMVar53 = (MIR_item_t)pVVar4->varr;
  if (pMVar53 != (MIR_item_t)0x0) {
    uVar25 = pVVar4->els_num + 1;
    if (pVVar4->size < uVar25) {
      sVar60 = (uVar25 >> 1) + uVar25;
      ppmVar40 = (macro_call_t *)realloc(pMVar53,sVar60 * 8);
      pVVar4->varr = ppmVar40;
      pVVar4->size = sVar60;
    }
    sVar60 = pVVar4->els_num;
    pVVar4->els_num = sVar60 + 1;
    pVVar4->varr[sVar60] = pmVar33;
    return;
  }
LAB_00193c41:
  try_param_macro_call_cold_8();
LAB_00193c46:
  try_param_macro_call_cold_16();
LAB_00193c4b:
  try_param_macro_call_cold_12();
LAB_00193c50:
  try_param_macro_call_cold_11();
LAB_00193c55:
  try_param_macro_call_cold_14();
LAB_00193c5a:
  try_param_macro_call_cold_13();
LAB_00193c5f:
  try_param_macro_call_cold_5();
LAB_00193c64:
  try_param_macro_call_cold_7();
LAB_00193c69:
  try_param_macro_call_cold_4();
  pMVar53 = pMVar53[5].item_link.prev;
  pcVar38 = (c2m_ctx_t)(pMVar53->item_link).prev;
  if (pcVar38 != (c2m_ctx_t)0x0) {
    puVar41 = &((token_t)pMVar53->data)->field_0x1;
    if (pMVar53->module < puVar41) {
      pMVar37 = (MIR_item_t)realloc(pcVar38,(long)(puVar41 + ((ulong)puVar41 >> 1)) * 8);
      (pMVar53->item_link).prev = pMVar37;
      pMVar53->module = (MIR_module_t)(puVar41 + ((ulong)puVar41 >> 1));
    }
    ptVar32 = (token_t)pMVar53->data;
    pMVar53->data = &ptVar32->field_0x1;
    (&((pMVar53->item_link).prev)->data)[(long)ptVar32] = pcVar52;
    return;
  }
  unget_next_pptoken_cold_1();
  if (((pcVar38 != (c2m_ctx_t)0x0) && (pcVar38->env[0].__jmpbuf[0] != 0)) &&
     (pcVar55 = (char *)pcVar38->ctx, (MIR_context_t)pcVar55 != (MIR_context_t)0x0)) {
    return;
  }
  VARR_token_arr_tlast_cold_1();
  *in_R8 = (char *)0x0;
  pcVar28 = pcVar52;
  pcVar54 = pcVar38;
  if (pcVar52 == (c2m_ctx_t)0x0) {
LAB_001941d6:
    get_header_name_cold_15();
LAB_001941db:
    get_header_name_cold_12();
LAB_001941e0:
    get_header_name_cold_13();
  }
  else {
    pMVar5 = pcVar52->ctx;
    if (pMVar5 != (MIR_context_t)0x0) {
      pptVar26 = (token_t *)pcVar52->env[0].__jmpbuf[0];
      if (pptVar26 == (token_t *)0x0) goto LAB_001941db;
      pMVar31 = (MIR_context_t)0x0;
      do {
        pcVar54 = (c2m_ctx_t)pptVar26[(long)pMVar31];
        if (*(short *)&pcVar54->ctx != 0x20) {
          if ((pMVar31 < pMVar5) && (*(int *)(pcVar54->env[0].__jmpbuf + 1) == 0x17)) {
            pMVar58 = (MIR_context_t)((long)&pMVar31->gen_ctx + 1);
            pcVar28 = (c2m_ctx_t)CONCAT71((int7)((ulong)pcVar52 >> 8),pMVar58 < pMVar5);
            if (pMVar58 < pMVar5) {
              pcVar61 = ((pos_t *)&pcVar54->options)->fname;
              pptVar13 = (token_t *)pcVar54->env[0].__jmpbuf[0];
              pVar16 = *(pos_t *)&pcVar54->options;
              pcVar54 = (c2m_ctx_t)pptVar26[(long)((long)&pMVar31->gen_ctx + 1)];
              pMVar57 = pMVar58;
              if (*(int *)(pcVar54->env[0].__jmpbuf + 1) == 0x19) goto LAB_00193db0;
              pcVar54 = (c2m_ctx_t)(2 - (long)pMVar5);
              goto LAB_00193d8d;
            }
          }
          break;
        }
        pMVar31 = (MIR_context_t)((long)&pMVar31->gen_ctx + 1);
      } while (pMVar5 != pMVar31);
    }
LAB_0019413a:
    pcVar30 = (c2m_ctx_t)pcVar52->ctx;
    if (pcVar30 == (c2m_ctx_t)0x0) {
      pcVar49 = (c2m_ctx_t)0x0;
    }
    else {
      puVar47 = (undefined8 *)pcVar52->env[0].__jmpbuf[0];
      if (puVar47 == (undefined8 *)0x0) goto LAB_001941e0;
      pcVar49 = (c2m_ctx_t)(ulong)(*(short *)*puVar47 == 0x20);
    }
    pcVar28 = (c2m_ctx_t)((long)&pcVar30[-1].gen_ctx + 7);
    if (pcVar49 != pcVar28) {
LAB_001941a4:
      error(pcVar38,0x1c3085,format,pcVar55);
      return;
    }
    if ((pcVar49 < pcVar30) && (lVar56 = pcVar52->env[0].__jmpbuf[0], lVar56 != 0)) {
      ptVar32 = *(token_t *)(lVar56 + (long)pcVar49 * 8);
      sVar1 = *(short *)ptVar32;
      if ((sVar1 == 0x102) || (sVar1 == 0x13e)) {
        get_include_fname(pcVar38,ptVar32,in_R8);
        return;
      }
      goto LAB_001941a4;
    }
  }
  get_header_name_cold_14();
LAB_001941ea:
  get_header_name_cold_9();
LAB_001941ef:
  get_header_name_cold_11();
LAB_001941f4:
  get_header_name_cold_10();
LAB_001941f9:
  get_header_name_cold_3();
LAB_001941fe:
  get_header_name_cold_8();
LAB_00194203:
  get_header_name_cold_7();
LAB_00194208:
  get_header_name_cold_6();
LAB_0019420d:
  get_header_name_cold_5();
LAB_00194212:
  get_header_name_cold_4();
  plVar46 = (long *)malloc(0x30);
  *plVar46 = (long)pcVar54;
  plVar46[1] = (long)pcVar28;
  plVar46[2] = extraout_RDX_00;
  *(undefined4 *)(plVar46 + 4) = 0;
  plVar46[3] = 0;
  pcVar55 = &DAT_00000018;
  puVar47 = (undefined8 *)malloc(0x18);
  plVar46[5] = (long)puVar47;
  if (puVar47 == (undefined8 *)0x0) {
    mir_varr_error(pcVar55);
  }
  *puVar47 = 0;
  puVar47[1] = 0x40;
  pvVar29 = malloc(0x200);
  puVar47[2] = pvVar29;
  return;
}

Assistant:

static void out_token (c2m_ctx_t c2m_ctx, token_t t) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;

  if (no_out_p || VARR_LENGTH (macro_call_t, macro_call_stack) != 0) {
    VARR_PUSH (token_t, output_buffer, t);
    return;
  }
  flush_buffer (c2m_ctx);
  pre_out_token_func (c2m_ctx, t);
}